

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::anon_unknown_15::reader_all::operator()(reader_all *this,error_code *e)

{
  bool bVar1;
  size_t sVar2;
  error_code *in_RSI;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *in_RDI;
  size_t n;
  error_code err;
  event_handler *in_stack_ffffffffffffff98;
  error_code *in_stack_ffffffffffffffa0;
  reader_all *this_00;
  error_code *in_stack_ffffffffffffffb8;
  mutable_buffer *in_stack_ffffffffffffffc0;
  stream_socket *in_stack_ffffffffffffffc8;
  __atomic_base<long> in_stack_ffffffffffffffd0;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(unsigned_long)in_RDI);
  }
  else {
    std::error_code::error_code(in_stack_ffffffffffffffa0);
    sVar2 = stream_socket::read_some
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
    in_RDI[8].p_ = (reader_all *)
                   ((long)&((in_RDI[8].p_)->super_callable<void_(const_std::error_code_&)>).
                           super_refcounted._vptr_refcounted + sVar2);
    operator+=((mutable_buffer *)in_stack_ffffffffffffffd0._M_i,(size_t)in_stack_ffffffffffffffc8);
    bVar1 = buffer_impl<char_*>::empty((buffer_impl<char_*> *)(in_RDI + 2));
    if ((bVar1) ||
       ((bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0),
        bVar1 && (bVar1 = basic_io_device::would_block(in_stack_ffffffffffffffa0), !bVar1)))) {
      callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(unsigned_long)in_RDI);
    }
    else {
      this_00 = in_RDI[9].p_;
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::intrusive_ptr
                (in_RDI,(reader_all *)&stack0xffffffffffffffc8,SUB81((ulong)this_00 >> 0x38,0));
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::reader_all>
                ((callback<void_(const_std::error_code_&)> *)this_00,
                 (intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)
                 in_stack_ffffffffffffff98);
      basic_io_device::on_readable((basic_io_device *)this_00,in_stack_ffffffffffffff98);
      callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x21bf7a);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)this_00);
    }
  }
  return;
}

Assistant:

void operator()(system::error_code const &e)
		{
			if(e) {
				h(e,count);
			}
			else {
				system::error_code err;
				size_t n=self->read_some(buf,err);
				count+=n;
				buf+=n;
				if(buf.empty() || (err && !basic_io_device::would_block(err))) {
					h(err,count);
				}
				else {
					self->on_readable(intrusive_ptr<reader_all>(this));
				}
			}
		}